

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::StripRight(FString *this)

{
  char *__src;
  int iVar1;
  FStringData *pFVar2;
  ulong strlen;
  ulong uVar3;
  
  __src = this->Chars;
  uVar3 = (ulong)*(uint *)(__src + -0xc);
  if (uVar3 != 0) {
    strlen = uVar3;
    do {
      if (strlen == 1) {
        strlen = 0;
        break;
      }
      iVar1 = isspace((uint)(byte)__src[strlen - 2]);
      strlen = strlen - 1;
    } while (iVar1 != 0);
    if (strlen != uVar3) {
      if (1 < *(int *)(__src + -4)) {
        pFVar2 = FStringData::Alloc(strlen);
        this->Chars = (char *)(pFVar2 + 1);
        pFVar2->Len = (uint)strlen;
        memcpy(pFVar2 + 1,__src,strlen);
        *(undefined1 *)((long)&pFVar2[1].Len + strlen) = 0;
        FStringData::Release((FStringData *)(__src + -0xc));
        return;
      }
      __src[strlen] = '\0';
      ReallocBuffer(this,strlen);
      return;
    }
  }
  return;
}

Assistant:

FString &FString::operator += (const FString &tail)
{
	size_t len1 = Len();
	size_t len2 = tail.Len();
	ReallocBuffer (len1 + len2);
	StrCopy (Chars + len1, tail);
	return *this;
}